

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_field_presence_test.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::
NoFieldPresenceSerializeTest_SetAllocatedAndReleaseTest_Test<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::TestBody(NoFieldPresenceSerializeTest_SetAllocatedAndReleaseTest_Test<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this)

{
  bool bVar1;
  char *pcVar2;
  pointer pbVar3;
  unsigned_long uVar4;
  string *ptr;
  char *in_R9;
  string local_5a8;
  AssertHelper local_588;
  Message local_580;
  string local_578;
  bool local_551;
  undefined1 local_550 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_520;
  Message local_518;
  bool local_509;
  undefined1 local_508 [8];
  AssertionResult gtest_ar__4;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  bytes_ptr;
  Message local_4e8;
  string local_4e0;
  unsigned_long local_4c0;
  undefined1 local_4b8 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_488;
  Message local_480;
  bool local_471;
  undefined1 local_470 [8];
  AssertionResult gtest_ar__3;
  __single_object allocated_string;
  unsigned_long local_438;
  size_t former_output_size;
  Message local_428;
  string local_420;
  undefined8 local_400;
  ComparisonBase<testing::internal::GtMatcher<int>,_int,_std::greater<void>_> local_3f8;
  GtMatcher<int> local_3f4;
  undefined1 local_3f0 [8];
  AssertionResult gtest_ar;
  AssertHelper local_3c0;
  Message local_3b8;
  bool local_3a9;
  undefined1 local_3a8 [8];
  AssertionResult gtest_ar__2;
  __single_object allocated_bytes;
  AssertHelper local_370;
  Message local_368;
  string local_360;
  bool local_339;
  undefined1 local_338 [8];
  AssertionResult gtest_ar__1;
  string local_320;
  AssertHelper local_300;
  Message local_2f8 [3];
  bool local_2d9;
  undefined1 local_2d8 [8];
  AssertionResult gtest_ar_;
  TypeParam *output_sink;
  TestAllTypes message;
  NoFieldPresenceSerializeTest_SetAllocatedAndReleaseTest_Test<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  message.field_0._664_8_ = this;
  proto2_nofieldpresence_unittest::TestAllTypes::TestAllTypes((TestAllTypes *)&output_sink);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ::GetOutputSinkRef(&this->
                             super_NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           );
  local_2d9 = protobuf::(anonymous_namespace)::TestSerialize<std::__cxx11::string>
                        ((MessageLite *)&output_sink,
                         (string *)
                         gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2d8,&local_2d9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d8);
  if (!bVar1) {
    testing::Message::Message(local_2f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_320,(internal *)local_2d8,
               (AssertionResult *)"TestSerialize(message, &output_sink)","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_300,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x496,pcVar2);
    testing::internal::AssertHelper::operator=(&local_300,local_2f8);
    testing::internal::AssertHelper::~AssertHelper(&local_300);
    std::__cxx11::string::~string((string *)&local_320);
    testing::Message::~Message(local_2f8);
  }
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d8);
  if (gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::GetOutput(&local_360,
                &this->
                 super_NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               );
    local_339 = (bool)std::__cxx11::string::empty();
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_338,&local_339,(type *)0x0);
    std::__cxx11::string::~string((string *)&local_360);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_338);
    if (!bVar1) {
      testing::Message::Message(&local_368);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&allocated_bytes,(internal *)local_338,
                 (AssertionResult *)"this->GetOutput().empty()","false","true",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_370,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
                 ,0x497,pcVar2);
      testing::internal::AssertHelper::operator=(&local_370,&local_368);
      testing::internal::AssertHelper::~AssertHelper(&local_370);
      std::__cxx11::string::~string((string *)&allocated_bytes);
      testing::Message::~Message(&local_368);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_338);
    std::make_unique<std::__cxx11::string,char_const(&)[5]>((char (*) [5])&gtest_ar__2.message_);
    pbVar3 = std::
             unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::release(&gtest_ar__2.message_);
    proto2_nofieldpresence_unittest::TestAllTypes::set_allocated_optional_bytes
              ((TestAllTypes *)&output_sink,pbVar3);
    local_3a9 = protobuf::(anonymous_namespace)::TestSerialize<std::__cxx11::string>
                          ((MessageLite *)&output_sink,
                           (string *)
                           gtest_ar_.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_3a8,&local_3a9,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3a8);
    if (!bVar1) {
      testing::Message::Message(&local_3b8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar.message_,(internal *)local_3a8,
                 (AssertionResult *)"TestSerialize(message, &output_sink)","false","true",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_3c0,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
                 ,0x49b,pcVar2);
      testing::internal::AssertHelper::operator=(&local_3c0,&local_3b8);
      testing::internal::AssertHelper::~AssertHelper(&local_3c0);
      std::__cxx11::string::~string((string *)&gtest_ar.message_);
      testing::Message::~Message(&local_3b8);
    }
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_3a8);
    if (gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      local_3f8.rhs_ = (int)testing::Gt<int>(4);
      local_3f4.super_ComparisonBase<testing::internal::GtMatcher<int>,_int,_std::greater<void>_>.
      rhs_ = (ComparisonBase<testing::internal::GtMatcher<int>,_int,_std::greater<void>_>)
             testing::internal::MakePredicateFormatterFromMatcher<testing::internal::GtMatcher<int>>
                       ((GtMatcher<int>)local_3f8.rhs_);
      NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::GetOutput(&local_420,
                  &this->
                   super_NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 );
      local_400 = std::__cxx11::string::size();
      testing::internal::PredicateFormatterFromMatcher<testing::internal::GtMatcher<int>>::
      operator()(local_3f0,(char *)&local_3f4,(unsigned_long *)"this->GetOutput().size()");
      std::__cxx11::string::~string((string *)&local_420);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3f0);
      if (!bVar1) {
        testing::Message::Message(&local_428);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3f0);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&former_output_size,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
                   ,0x49d,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&former_output_size,&local_428);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&former_output_size);
        testing::Message::~Message(&local_428);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_3f0);
      NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::GetOutput((string *)&allocated_string,
                  &this->
                   super_NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 );
      uVar4 = std::__cxx11::string::size();
      std::__cxx11::string::~string((string *)&allocated_string);
      local_438 = uVar4;
      std::make_unique<std::__cxx11::string,char_const(&)[1]>((char (*) [1])&gtest_ar__3.message_);
      pbVar3 = std::
               unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::release(&gtest_ar__3.message_);
      proto2_nofieldpresence_unittest::TestAllTypes::set_allocated_optional_string
                ((TestAllTypes *)&output_sink,pbVar3);
      local_471 = protobuf::(anonymous_namespace)::TestSerialize<std::__cxx11::string>
                            ((MessageLite *)&output_sink,
                             (string *)
                             gtest_ar_.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_470,&local_471,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_470);
      if (!bVar1) {
        testing::Message::Message(&local_480);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar_1.message_,(internal *)local_470,
                   (AssertionResult *)"TestSerialize(message, &output_sink)","false","true",in_R9);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_488,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
                   ,0x4a3,pcVar2);
        testing::internal::AssertHelper::operator=(&local_488,&local_480);
        testing::internal::AssertHelper::~AssertHelper(&local_488);
        std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
        testing::Message::~Message(&local_480);
      }
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_470);
      if (gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ == 0) {
        NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::GetOutput(&local_4e0,
                    &this->
                     super_NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   );
        local_4c0 = std::__cxx11::string::size();
        testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                  ((EqHelper *)local_4b8,"former_output_size","this->GetOutput().size()",&local_438,
                   &local_4c0);
        std::__cxx11::string::~string((string *)&local_4e0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4b8);
        if (!bVar1) {
          testing::Message::Message(&local_4e8);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4b8);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&bytes_ptr,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
                     ,0x4a5,pcVar2);
          testing::internal::AssertHelper::operator=((AssertHelper *)&bytes_ptr,&local_4e8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&bytes_ptr);
          testing::Message::~Message(&local_4e8);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_4b8);
        ptr = proto2_nofieldpresence_unittest::TestAllTypes::release_optional_bytes_abi_cxx11_
                        ((TestAllTypes *)&output_sink);
        absl::lts_20250127::WrapUnique<std::__cxx11::string>
                  ((lts_20250127 *)&gtest_ar__4.message_,ptr);
        local_509 = protobuf::(anonymous_namespace)::TestSerialize<std::__cxx11::string>
                              ((MessageLite *)&output_sink,
                               (string *)
                               gtest_ar_.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl);
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_508,&local_509,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_508);
        if (!bVar1) {
          testing::Message::Message(&local_518);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__5.message_,(internal *)local_508,
                     (AssertionResult *)"TestSerialize(message, &output_sink)","false","true",in_R9)
          ;
          pcVar2 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_520,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
                     ,0x4a8,pcVar2);
          testing::internal::AssertHelper::operator=(&local_520,&local_518);
          testing::internal::AssertHelper::~AssertHelper(&local_520);
          std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
          testing::Message::~Message(&local_518);
        }
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._5_3_ = 0;
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_508);
        if (gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ == 0) {
          NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::GetOutput(&local_578,
                      &this->
                       super_NoFieldPresenceSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     );
          local_551 = (bool)std::__cxx11::string::empty();
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)local_550,&local_551,(type *)0x0);
          std::__cxx11::string::~string((string *)&local_578);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_550);
          if (!bVar1) {
            testing::Message::Message(&local_580);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_5a8,(internal *)local_550,
                       (AssertionResult *)"this->GetOutput().empty()","false","true",in_R9);
            pcVar2 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_588,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
                       ,0x4aa,pcVar2);
            testing::internal::AssertHelper::operator=(&local_588,&local_580);
            testing::internal::AssertHelper::~AssertHelper(&local_588);
            std::__cxx11::string::~string((string *)&local_5a8);
            testing::Message::~Message(&local_580);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_550);
          gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ = 0;
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar__4.message_);
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar__3.message_);
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar__2.message_);
  }
  proto2_nofieldpresence_unittest::TestAllTypes::~TestAllTypes((TestAllTypes *)&output_sink);
  return;
}

Assistant:

TYPED_TEST(NoFieldPresenceSerializeTest, SetAllocatedAndReleaseTest) {
  // Check that setting an empty string via set_allocated_foo behaves properly;
  // Check that serializing after release_foo does not generate output for foo.
  TestAllTypes message;
  TypeParam& output_sink = this->GetOutputSinkRef();

  // All default values -> no output.
  ASSERT_TRUE(TestSerialize(message, &output_sink));
  EXPECT_TRUE(this->GetOutput().empty());

  auto allocated_bytes = std::make_unique<std::string>("test");
  message.set_allocated_optional_bytes(allocated_bytes.release());
  ASSERT_TRUE(TestSerialize(message, &output_sink));
  EXPECT_THAT(this->GetOutput().size(),
              Gt(4));  // 4-byte-long string + tag/value + len

  size_t former_output_size = this->GetOutput().size();

  auto allocated_string = std::make_unique<std::string>("");
  message.set_allocated_optional_string(allocated_string.release());
  ASSERT_TRUE(TestSerialize(message, &output_sink));
  // empty string not serialized.
  EXPECT_EQ(former_output_size, this->GetOutput().size());

  auto bytes_ptr = absl::WrapUnique(message.release_optional_bytes());
  ASSERT_TRUE(TestSerialize(message, &output_sink));
  EXPECT_TRUE(
      this->GetOutput().empty());  // released fields are not serialized.
}